

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void xmlParseInternalSubset(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlEntityPtr pxVar3;
  xmlParserInputPtr pxVar4;
  xmlChar xVar5;
  uint uVar6;
  
  if (*ctxt->input->cur == '[') {
    iVar1 = ctxt->inputNr;
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
LAB_0013e2d2:
    pxVar2 = ctxt->input->cur;
    xVar5 = *pxVar2;
    if (((xVar5 == ']') && (ctxt->inputNr <= iVar1)) || (1 < ctxt->disableSAX)) goto LAB_0013e3c9;
    if ((ctxt->inSubset == 2) ||
       ((pxVar3 = ctxt->input->entity, pxVar3 != (xmlEntityPtr)0x0 &&
        (pxVar3->etype == XML_EXTERNAL_PARAMETER_ENTITY)))) {
      if (xVar5 == '%') {
LAB_0013e35a:
        xmlParsePEReference(ctxt);
      }
      else {
        if (xVar5 != '<') goto LAB_0013e3b0;
        xVar5 = pxVar2[1];
        if (xVar5 != '!') goto LAB_0013e343;
        if (pxVar2[2] != '[') goto LAB_0013e350;
        xmlParseConditionalSections(ctxt);
      }
    }
    else {
      if (xVar5 == '%') goto LAB_0013e35a;
      if (xVar5 != '<') goto LAB_0013e3b0;
      xVar5 = pxVar2[1];
LAB_0013e343:
      if ((xVar5 != '?') && (xVar5 != '!')) goto LAB_0013e3b0;
LAB_0013e350:
      xmlParseMarkupDecl(ctxt);
    }
    xmlSkipBlankCharsPE(ctxt);
    pxVar4 = ctxt->input;
    uVar6 = pxVar4->flags;
    if ((uVar6 & 0x40) == 0) {
      xmlParserShrink(ctxt);
      pxVar4 = ctxt->input;
      uVar6 = pxVar4->flags;
    }
    if (((uVar6 & 0x40) == 0) && ((long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    goto LAB_0013e2d2;
  }
LAB_0013e3eb:
  if ((ctxt->wellFormed != 0) && (*ctxt->input->cur != '>')) {
    xmlFatalErr(ctxt,XML_ERR_DOCTYPE_NOT_FINISHED,(char *)0x0);
    return;
  }
  xmlNextChar(ctxt);
  return;
LAB_0013e3b0:
  xmlFatalErr(ctxt,XML_ERR_INT_SUBSET_NOT_FINISHED,(char *)0x0);
LAB_0013e3c9:
  while (iVar1 < ctxt->inputNr) {
    xmlPopPE(ctxt);
  }
  if (*ctxt->input->cur == ']') {
    xmlNextChar(ctxt);
    xmlSkipBlankChars(ctxt);
  }
  goto LAB_0013e3eb;
}

Assistant:

static void
xmlParseInternalSubset(xmlParserCtxtPtr ctxt) {
    /*
     * Is there any DTD definition ?
     */
    if (RAW == '[') {
        int oldInputNr = ctxt->inputNr;

        NEXT;
	/*
	 * Parse the succession of Markup declarations and
	 * PEReferences.
	 * Subsequence (markupdecl | PEReference | S)*
	 */
	SKIP_BLANKS;
	while (((RAW != ']') || (ctxt->inputNr > oldInputNr)) &&
               (PARSER_STOPPED(ctxt) == 0)) {

            /*
             * Conditional sections are allowed from external entities included
             * by PE References in the internal subset.
             */
            if ((PARSER_EXTERNAL(ctxt)) &&
                (RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
                xmlParseConditionalSections(ctxt);
            } else if ((RAW == '<') && ((NXT(1) == '!') || (NXT(1) == '?'))) {
	        xmlParseMarkupDecl(ctxt);
            } else if (RAW == '%') {
	        xmlParsePEReference(ctxt);
            } else {
		xmlFatalErr(ctxt, XML_ERR_INT_SUBSET_NOT_FINISHED, NULL);
                break;
            }
	    SKIP_BLANKS_PE;
            SHRINK;
            GROW;
	}

        while (ctxt->inputNr > oldInputNr)
            xmlPopPE(ctxt);

	if (RAW == ']') {
	    NEXT;
	    SKIP_BLANKS;
	}
    }

    /*
     * We should be at the end of the DOCTYPE declaration.
     */
    if ((ctxt->wellFormed) && (RAW != '>')) {
	xmlFatalErr(ctxt, XML_ERR_DOCTYPE_NOT_FINISHED, NULL);
	return;
    }
    NEXT;
}